

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall glslang::TGlslIoMapper::~TGlslIoMapper(TGlslIoMapper *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *pmVar1;
  ulong local_18;
  size_t stage;
  TGlslIoMapper *this_local;
  
  (this->super_TIoMapper)._vptr_TIoMapper = (_func_int **)&PTR__TGlslIoMapper_010dd770;
  for (local_18 = 0; local_18 < 0xe; local_18 = local_18 + 1) {
    if (this->inVarMaps[local_18] != (TVarLiveMap *)0x0) {
      pmVar1 = this->inVarMaps[local_18];
      if (pmVar1 != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     *)0x0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map(pmVar1);
        ::operator_delete(pmVar1,0x30);
      }
      this->inVarMaps[local_18] = (TVarLiveMap *)0x0;
    }
    if (this->outVarMaps[local_18] != (TVarLiveMap *)0x0) {
      pmVar1 = this->outVarMaps[local_18];
      if (pmVar1 != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     *)0x0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map(pmVar1);
        ::operator_delete(pmVar1,0x30);
      }
      this->outVarMaps[local_18] = (TVarLiveMap *)0x0;
    }
    if (this->uniformVarMap[local_18] != (TVarLiveMap *)0x0) {
      pmVar1 = this->uniformVarMap[local_18];
      if (pmVar1 != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                     *)0x0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map(pmVar1);
        ::operator_delete(pmVar1,0x30);
      }
      this->uniformVarMap[local_18] = (TVarLiveMap *)0x0;
    }
    if (this->intermediates[local_18] != (TIntermediate *)0x0) {
      this->intermediates[local_18] = (TIntermediate *)0x0;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&this->autoPushConstantBlockName);
  TIoMapper::~TIoMapper(&this->super_TIoMapper);
  return;
}

Assistant:

TGlslIoMapper::~TGlslIoMapper() {
    for (size_t stage = 0; stage < EShLangCount; stage++) {
        if (inVarMaps[stage] != nullptr) {
            delete inVarMaps[stage];
            inVarMaps[stage] = nullptr;
        }
        if (outVarMaps[stage] != nullptr) {
            delete outVarMaps[stage];
            outVarMaps[stage] = nullptr;
        }
        if (uniformVarMap[stage] != nullptr) {
            delete uniformVarMap[stage];
            uniformVarMap[stage] = nullptr;
        }
        if (intermediates[stage] != nullptr)
            intermediates[stage] = nullptr;
    }
}